

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.H
# Opt level: O1

void kill_selection(Fl_Text_Editor *e)

{
  Fl_Text_Buffer *pFVar1;
  
  pFVar1 = (e->super_Fl_Text_Display).mBuffer;
  if ((pFVar1->mPrimary).mSelected != false) {
    Fl_Text_Display::insert_position(&e->super_Fl_Text_Display,(pFVar1->mPrimary).mStart);
    Fl_Text_Buffer::remove_selection((e->super_Fl_Text_Display).mBuffer);
    return;
  }
  return;
}

Assistant:

Fl_Text_Buffer* buffer() const { return mBuffer; }